

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestPackedTypesLite::ByteSizeLong(TestPackedTypesLite *this)

{
  bool bVar1;
  int iVar2;
  RepeatedField<int> *pRVar3;
  size_t sVar4;
  RepeatedField<long> *pRVar5;
  size_t sVar6;
  RepeatedField<unsigned_int> *value;
  size_t sVar7;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  size_t sVar18;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestPackedTypesLite *this_;
  TestPackedTypesLite *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar3 = _internal_packed_int32(this);
  sVar4 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar3,2,&(this->field_0)._impl_._packed_int32_cached_byte_size_);
  pRVar5 = _internal_packed_int64(this);
  sVar6 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                    (pRVar5,2,&(this->field_0)._impl_._packed_int64_cached_byte_size_);
  value = _internal_packed_uint32(this);
  sVar7 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                    (value,2,&(this->field_0)._impl_._packed_uint32_cached_byte_size_);
  value_00 = _internal_packed_uint64(this);
  sVar8 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                    (value_00,2,&(this->field_0)._impl_._packed_uint64_cached_byte_size_);
  pRVar3 = _internal_packed_sint32(this);
  sVar9 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                    (pRVar3,2,&(this->field_0)._impl_._packed_sint32_cached_byte_size_);
  pRVar5 = _internal_packed_sint64(this);
  sVar10 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                     (pRVar5,2,&(this->field_0)._impl_._packed_sint64_cached_byte_size_);
  iVar2 = _internal_packed_fixed32_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  lVar12 = sVar11 * 4;
  if (lVar12 == 0) {
    local_d8 = 0;
  }
  else {
    sVar11 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar12);
    local_d8 = sVar11 + 2;
  }
  iVar2 = _internal_packed_fixed64_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  lVar13 = sVar11 * 8;
  if (lVar13 == 0) {
    local_e0 = 0;
  }
  else {
    sVar11 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar13);
    local_e0 = sVar11 + 2;
  }
  iVar2 = _internal_packed_sfixed32_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  lVar14 = sVar11 * 4;
  if (lVar14 == 0) {
    local_e8 = 0;
  }
  else {
    sVar11 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar14);
    local_e8 = sVar11 + 2;
  }
  iVar2 = _internal_packed_sfixed64_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  lVar15 = sVar11 * 8;
  if (lVar15 == 0) {
    local_f0 = 0;
  }
  else {
    sVar11 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar15);
    local_f0 = sVar11 + 2;
  }
  iVar2 = _internal_packed_float_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  lVar16 = sVar11 * 4;
  if (lVar16 == 0) {
    local_f8 = 0;
  }
  else {
    sVar11 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar16);
    local_f8 = sVar11 + 2;
  }
  iVar2 = _internal_packed_double_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  lVar17 = sVar11 * 8;
  if (lVar17 == 0) {
    local_100 = 0;
  }
  else {
    sVar11 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar17);
    local_100 = sVar11 + 2;
  }
  iVar2 = _internal_packed_bool_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar2);
  if (sVar11 == 0) {
    local_108 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar11);
    local_108 = sVar18 + 2;
  }
  pRVar3 = _internal_packed_enum(this);
  sStack_58 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                        (pRVar3,2,&(this->field_0)._impl_._packed_enum_cached_byte_size_);
  sStack_58 = sStack_58 +
              local_108 + sVar11 +
              local_100 + lVar17 +
              local_f8 + lVar16 +
              local_f0 + lVar15 +
              local_e8 + lVar14 +
              local_e0 + lVar13 + local_d8 + lVar12 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar4
  ;
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar12 = std::__cxx11::string::size();
    sStack_58 = lVar12 + sStack_58;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar2);
  return sStack_58;
}

Assistant:

::size_t TestPackedTypesLite::ByteSizeLong() const {
  const TestPackedTypesLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestPackedTypesLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 packed_int32 = 90 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32(), 2,
              this_._impl_._packed_int32_cached_byte_size_);
    }
    // repeated int64 packed_int64 = 91 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_packed_int64(), 2,
              this_._impl_._packed_int64_cached_byte_size_);
    }
    // repeated uint32 packed_uint32 = 92 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_packed_uint32(), 2,
              this_._impl_._packed_uint32_cached_byte_size_);
    }
    // repeated uint64 packed_uint64 = 93 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_packed_uint64(), 2,
              this_._impl_._packed_uint64_cached_byte_size_);
    }
    // repeated sint32 packed_sint32 = 94 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_packed_sint32(), 2,
              this_._impl_._packed_sint32_cached_byte_size_);
    }
    // repeated sint64 packed_sint64 = 95 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_packed_sint64(), 2,
              this_._impl_._packed_sint64_cached_byte_size_);
    }
    // repeated fixed32 packed_fixed32 = 96 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 packed_fixed64 = 97 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 packed_sfixed32 = 98 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 packed_sfixed64 = 99 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float packed_float = 100 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double packed_double = 101 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool = 102 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated .proto2_unittest.ForeignEnumLite packed_enum = 103 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_enum(), 2, this_._impl_._packed_enum_cached_byte_size_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}